

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlhelper.cpp
# Opt level: O1

void hsql::printStatementInfo(SQLStatement *stmt)

{
  int iVar1;
  
  iVar1 = (*stmt->_vptr_SQLStatement[2])();
  switch(iVar1) {
  case 1:
    printSelectStatementInfo((SelectStatement *)stmt,0);
    return;
  case 2:
    printImportStatementInfo((ImportStatement *)stmt,0);
    return;
  case 3:
    printInsertStatementInfo((InsertStatement *)stmt,0);
    return;
  default:
    return;
  case 6:
    printCreateStatementInfo((CreateStatement *)stmt,0);
    return;
  case 0xd:
    printShowStatementInfo((ShowStatement *)stmt,0);
    return;
  case 0xe:
    inprint("QuitStatment",0);
    return;
  }
}

Assistant:

void printStatementInfo(const SQLStatement* stmt) {
    switch (stmt->type()) {
    case kStmtSelect:
      printSelectStatementInfo((const SelectStatement*) stmt, 0);
      break;
    case kStmtInsert:
      printInsertStatementInfo((const InsertStatement*) stmt, 0);
      break;
    case kStmtCreate:
      printCreateStatementInfo((const CreateStatement*) stmt, 0);
      break;
    case kStmtImport:
      printImportStatementInfo((const ImportStatement*) stmt, 0);
      break;
    case kStmtShow:
        printShowStatementInfo((const ShowStatement*) stmt, 0);
        break;
    case kStmtQuit:
        printQuitStatementInfo((const QuitStatement*) stmt, 0);
        break;
    default:
      break;
    }
  }